

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_cryptor.c
# Opt level: O0

int aes_ctr_encrypt_counter(archive_crypto_ctx *ctx)

{
  int iVar1;
  int local_1c;
  int r;
  int outl;
  archive_crypto_ctx *ctx_local;
  
  local_1c = 0;
  _r = ctx;
  iVar1 = EVP_EncryptInit_ex((EVP_CIPHER_CTX *)ctx->ctx,(EVP_CIPHER *)ctx->type,(ENGINE *)0x0,
                             ctx->key,(uchar *)0x0);
  if (iVar1 == 0) {
    ctx_local._4_4_ = -1;
  }
  else {
    iVar1 = EVP_EncryptUpdate((EVP_CIPHER_CTX *)_r->ctx,_r->encr_buf,&local_1c,_r->nonce,0x10);
    if ((iVar1 == 0) || (local_1c != 0x10)) {
      ctx_local._4_4_ = -1;
    }
    else {
      ctx_local._4_4_ = 0;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static int
aes_ctr_encrypt_counter(archive_crypto_ctx *ctx)
{
	int outl = 0;
	int r;

	r = EVP_EncryptInit_ex(ctx->ctx, ctx->type, NULL, ctx->key, NULL);
	if (r == 0)
		return -1;
	r = EVP_EncryptUpdate(ctx->ctx, ctx->encr_buf, &outl, ctx->nonce,
	    AES_BLOCK_SIZE);
	if (r == 0 || outl != AES_BLOCK_SIZE)
		return -1;
	return 0;
}